

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1;
  EqualsValueClauseSyntax *args;
  DeclaratorSyntax *pDVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  EqualsValueClauseSyntax *in_stack_ffffffffffffffc0;
  BumpAllocator *this;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  this = TVar2._0_8_;
  args_1 = deepClone<slang::syntax::VariableDimensionSyntax>(in_stack_00000070,in_stack_00000068);
  if (*(long *)(__fn + 0x60) == 0) {
    args = (EqualsValueClauseSyntax *)0x0;
  }
  else {
    args = deepClone<slang::syntax::EqualsValueClauseSyntax>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DeclaratorSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::syntax::EqualsValueClauseSyntax*>
                     (this,(Token *)args,args_1,(EqualsValueClauseSyntax **)__child_stack);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DeclaratorSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DeclaratorSyntax>(
        node.name.deepClone(alloc),
        *deepClone(node.dimensions, alloc),
        node.initializer ? deepClone(*node.initializer, alloc) : nullptr
    );
}